

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

ssize_t __thiscall
xray_re::xr_ini_writer::write(xr_ini_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((int)__n != 0) {
    std::operator+(&bStack_68,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
    std::operator+(&local_48,&bStack_68,"\"");
    std::__cxx11::string::operator=((string *)__buf,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&bStack_68);
  }
  xr_writer::w_sf((xr_writer *)this,"%9s%-34s = %s\n","",CONCAT44(in_register_00000034,__fd),*__buf)
  ;
  return extraout_RAX;
}

Assistant:

void xr_ini_writer::write(const char *key, std::string value, bool enclose)
{
	if (enclose)
		value = "\"" + value + "\"";
	w_sf("%9s%-34s = %s\n", "",key, value.c_str());
}